

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int64_t *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  StreamReader *pSVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  char *pcVar12;
  uint __val;
  byte *pbVar13;
  _Alloc_hider _Var14;
  char *pcVar15;
  long lVar16;
  byte *pbVar17;
  uint uVar18;
  uint __len;
  undefined4 uVar19;
  char sc;
  char c;
  string __str;
  stringstream ss;
  char local_219;
  string local_218;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  long local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar5 = Char1(this,&local_219);
  if (bVar5) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if (local_219 == '+') {
      bVar5 = true;
LAB_003a9d62:
      local_218._M_dataplus._M_p._0_1_ = local_219;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
      pSVar7 = this->_sr;
      uVar11 = pSVar7->idx_;
      if (uVar11 < pSVar7->length_) {
        while (pSVar7->binary_[uVar11] != '\0') {
          bVar6 = Char1(this,(char *)&local_1f8);
          if (!bVar6) goto LAB_003aa2d5;
          if (9 < (byte)((char)local_1f8 - 0x30U)) {
            pSVar7 = this->_sr;
            if ((0 < (long)pSVar7->idx_) && (uVar11 = pSVar7->idx_ - 1, uVar11 <= pSVar7->length_))
            {
              pSVar7->idx_ = uVar11;
            }
            break;
          }
          local_218._M_dataplus._M_p._0_1_ = (char)local_1f8;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
          pSVar7 = this->_sr;
          uVar11 = pSVar7->idx_;
          if (pSVar7->length_ <= uVar11) break;
        }
      }
      if (bVar5) {
        ::std::__cxx11::stringbuf::str();
        sVar4 = local_218._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (sVar4 == 1) {
          pcVar15 = "Integer value expected but got sign character only.\n";
          pcVar12 = "";
          goto LAB_003a9fbf;
        }
      }
      ::std::__cxx11::stringbuf::str();
      if (local_218._M_string_length < 2) {
        bVar5 = false;
      }
      else {
        ::std::__cxx11::stringbuf::str();
        bVar5 = (char)*local_1f8 == '0';
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,local_1e8 + 1);
        }
      }
      paVar2 = &local_218.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        local_218._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"Zero padded integer value is not allowed.\n","");
        PushError(this,&local_218);
        local_1c8._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
        _Var14._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar2) goto LAB_003aa2cd;
        goto LAB_003aa2d5;
      }
      ::std::__cxx11::stringbuf::str();
      _Var14._M_p = local_218._M_dataplus._M_p;
      ::std::__cxx11::stringbuf::str();
      plVar9 = local_1f8;
      ::std::__cxx11::stringbuf::str();
      pbVar17 = (byte *)((long)plVar9 + local_1d0);
      uVar19 = 0xffffffff;
      if ((byte *)_Var14._M_p == pbVar17) {
LAB_003aa309:
        lVar16 = 0;
      }
      else {
        if (*_Var14._M_p != 0x2d) {
          if (*_Var14._M_p == 0x2b) {
            _Var14._M_p = _Var14._M_p + 1;
          }
          if ((byte *)_Var14._M_p != pbVar17) {
            lVar16 = 0;
            do {
              bVar3 = *_Var14._M_p;
              if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
              break;
              if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_003aa1dc;
              if (0xccccccccccccccc < lVar16) {
                uVar19 = 0xfffffffd;
                goto LAB_003aa1dc;
              }
              if (lVar16 == 0xccccccccccccccc && 7 < (byte)(bVar3 - 0x30)) {
                uVar19 = 0xfffffffd;
                lVar16 = 0xccccccccccccccc;
                goto LAB_003aa1dc;
              }
              lVar16 = (ulong)(byte)(bVar3 - 0x30) + lVar16 * 10;
              _Var14._M_p = _Var14._M_p + 1;
            } while (_Var14._M_p < pbVar17);
            goto LAB_003aa1d9;
          }
          goto LAB_003aa309;
        }
        pbVar13 = (byte *)(_Var14._M_p + 1);
        if (pbVar13 == pbVar17) goto LAB_003aa309;
        lVar16 = 0;
        do {
          bVar3 = *pbVar13;
          if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) break;
          if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_003aa1dc;
          if (lVar16 < -0xccccccccccccccc) {
            uVar19 = 0xfffffffc;
            goto LAB_003aa1dc;
          }
          if (lVar16 == -0xccccccccccccccc && 8 < (byte)(bVar3 - 0x30)) {
            uVar19 = 0xfffffffc;
            lVar16 = -0xccccccccccccccc;
            goto LAB_003aa1dc;
          }
          lVar16 = lVar16 * 10 - (ulong)(byte)(bVar3 - 0x30);
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 < pbVar17);
LAB_003aa1d9:
        uVar19 = 0;
      }
LAB_003aa1dc:
      paVar2 = &local_218.field_2;
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      switch(uVar19) {
      case 0:
        *value = lVar16;
        bVar5 = true;
        goto LAB_003aa2d7;
      case 0xfffffffd:
        pcVar15 = "Integer value overflows.\n";
        pcVar12 = "";
        break;
      case 0xfffffffe:
        pcVar15 = "Negative sign `-` specified for uint32 integer.\n";
        pcVar12 = "";
        break;
      case 0xffffffff:
        pcVar15 = "Not an 32bit unsigned integer literal.\n";
        pcVar12 = "";
        break;
      default:
        pcVar15 = "Invalid integer literal\n";
        pcVar12 = "";
      }
      local_218._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar15,pcVar12);
      PushError(this,&local_218);
      local_1c8._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
      _Var14._M_p = local_218._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == paVar2) goto LAB_003aa2d5;
    }
    else if (local_219 == '-') {
      local_218._M_dataplus._M_p._0_1_ = 0x2d;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_218,1);
      pcVar15 = "Unsigned value expected but got \'-\' sign.";
      pcVar12 = "";
LAB_003a9fbf:
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar15,pcVar12);
      PushError(this,&local_218);
      local_1c8._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
      _Var14._M_p = local_218._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_003aa2d5;
    }
    else {
      if ((byte)(local_219 - 0x30U) < 10) {
        bVar5 = false;
        goto LAB_003a9d62;
      }
      uVar18 = (uint)local_219;
      __val = -uVar18;
      if (0 < (int)uVar18) {
        __val = uVar18;
      }
      __len = 1;
      if (9 < __val) {
        __len = 3 - (__val < 100);
      }
      local_1d8 = &local_1c8;
      ::std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)__len - (local_219 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_1d8->_M_local_buf + (uVar18 >> 0x1f),__len,__val);
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x3ef6b8);
      plVar9 = puVar8 + 2;
      if ((long *)*puVar8 == plVar9) {
        local_1e8 = *plVar9;
        uStack_1e0 = puVar8[3];
        local_1f8 = &local_1e8;
      }
      else {
        local_1e8 = *plVar9;
        local_1f8 = (long *)*puVar8;
      }
      local_1f0 = puVar8[1];
      *puVar8 = plVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218.field_2._8_8_ = puVar8[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar10;
        local_218._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_218._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      PushError(this,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      _Var14._M_p = (pointer)local_1d8;
      if (local_1d8 == &local_1c8) goto LAB_003aa2d5;
    }
LAB_003aa2cd:
    operator_delete(_Var14._M_p,local_1c8._M_allocated_capacity + 1);
  }
LAB_003aa2d5:
  bVar5 = false;
LAB_003aa2d7:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar5;
}

Assistant:

bool AsciiParser::ReadBasicType(int64_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  // TODO(syoyo): Use ryu parse.
#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = std::stoull(ss.str());
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }

  return true;
#else
  // use jsteemann/atoi
  int retcode;
  auto result = jsteemann::atoi<int64_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif

  // std::cout << "read int ok\n";
}